

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_file.c
# Opt level: O0

int test_hduname(int hdunum1,int hdunum2)

{
  HduName *pHVar1;
  HduName *pHVar2;
  int iVar3;
  size_t sVar4;
  HduName *p2;
  HduName *p1;
  int hdunum2_local;
  int hdunum1_local;
  
  pHVar1 = hduname[hdunum1 + -1];
  pHVar2 = hduname[hdunum2 + -1];
  sVar4 = strlen(pHVar1->extname);
  if ((sVar4 == 0) || (sVar4 = strlen(pHVar2->extname), sVar4 == 0)) {
    return 0;
  }
  iVar3 = strcmp(pHVar1->extname,pHVar2->extname);
  if ((iVar3 == 0) &&
     (((pHVar1->hdutype == pHVar2->hdutype && (pHVar2->extver == pHVar1->extver)) &&
      (hdunum1 != hdunum2)))) {
    return 1;
  }
  return 0;
}

Assistant:

int test_hduname (int hdunum1,		/* index of first hdu */
		  int hdunum2		/* index of second hdu */
                  )
{ 
    HduName *p1;
    HduName *p2; 

    p1 = hduname[hdunum1-1];
    p2 = hduname[hdunum2-1];
    if(!strlen(p1->extname) || !strlen(p2->extname)) return 0;
    if(!strcmp(p1->extname,p2->extname) && p1->hdutype == p2->hdutype
       && p2->extver == p1->extver && hdunum1 != hdunum2){ 
	   return 1;
    } 
    return 0;
}